

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O3

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::Append(ON_SubDComponentRefList *this,ON_SubDComponentRef *src_ref)

{
  bool bVar1;
  ON_SubD *this_00;
  ON_SubDComponentRef *pOVar2;
  ON_SubDComponentRef *local_20;
  
  pOVar2 = &ON_SubDComponentRef::Empty;
  if (src_ref != (ON_SubDComponentRef *)0x0) {
    this_00 = (src_ref->m_subd_ref).m_subd_sp.
              super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 == (element_type *)0x0) {
      this_00 = &ON_SubD::Empty;
    }
    bVar1 = ON_SubD::IsEmpty(this_00);
    if (!bVar1) {
      bVar1 = Internal_UpdateCount(this,src_ref,1);
      if (bVar1) {
        pOVar2 = (ON_SubDComponentRef *)operator_new(0x40);
        ON_SubDComponentRef::ON_SubDComponentRef(pOVar2,src_ref);
        local_20 = pOVar2;
        ON_SimpleArray<ON_SubDComponentRef_*>::Append(&this->m_list,&local_20);
        this->m_bIsClean = false;
        pOVar2 = (this->m_list).m_a[(ulong)(uint)(this->m_list).m_count - 1];
      }
    }
  }
  return pOVar2;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::Append(const ON_SubDComponentRef* src_ref)
{
  for (;;)
  {
    if (nullptr == src_ref)
      break;
    if (src_ref->SubD().IsEmpty())
      break;
    if (false == Internal_UpdateCount(*src_ref,1))
      break;
    m_list.Append(new ON_SubDComponentRef(*src_ref));
    m_bIsClean = false;
    return **(m_list.Last());
  }
  return ON_SubDComponentRef::Empty;
}